

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

TypedAttribute<Imf_2_5::TimeCode> *
Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::cast(Attribute *attribute)

{
  TypeExc *this;
  long in_RDI;
  TypedAttribute<Imf_2_5::TimeCode> *t;
  TypedAttribute<Imf_2_5::TimeCode> *local_20;
  
  if (in_RDI == 0) {
    local_20 = (TypedAttribute<Imf_2_5::TimeCode> *)0x0;
  }
  else {
    local_20 = (TypedAttribute<Imf_2_5::TimeCode> *)
               __dynamic_cast(in_RDI,&Attribute::typeinfo,&typeinfo,0);
  }
  if (local_20 == (TypedAttribute<Imf_2_5::TimeCode> *)0x0) {
    this = (TypeExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::TypeExc::TypeExc(this,"Unexpected attribute type.");
    __cxa_throw(this,&Iex_2_5::TypeExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  return local_20;
}

Assistant:

const TypedAttribute<T> *
TypedAttribute<T>::cast (const Attribute *attribute)
{
    const TypedAttribute<T> *t =
	dynamic_cast <const TypedAttribute<T> *> (attribute);

    if (t == 0)
	throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return t;
}